

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes
          (SocketData *this,SocketType sock,int availLen,bool *complete,RTPMemoryManager *pMgr)

{
  ssize_t sVar1;
  uint8_t *puVar2;
  int local_50;
  int local_4c;
  int r_1;
  int num_1;
  int shift;
  int i;
  int l;
  int r;
  int num;
  int numLengthBuffer;
  RTPMemoryManager *pMgr_local;
  bool *complete_local;
  int availLen_local;
  SocketType sock_local;
  SocketData *this_local;
  
  complete_local._0_4_ = availLen;
  if (this->m_lengthBufferOffset < 2) {
    if (this->m_pDataBuffer != (uint8_t *)0x0) {
      __assert_fail("m_pDataBuffer == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astronautlabs[P]rtp/src/rtptcptransmitter.cpp"
                    ,0x365,
                    "int jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType, int, bool &, RTPMemoryManager *)"
                   );
    }
    l = 2 - this->m_lengthBufferOffset;
    if (availLen < l) {
      l = availLen;
    }
    i = 0;
    if (0 < l) {
      sVar1 = recv(sock,this->m_lengthBuffer + this->m_lengthBufferOffset,(long)l,0);
      i = (int)sVar1;
      if (i < 0) {
        return -0xc5;
      }
    }
    this->m_lengthBufferOffset = i + this->m_lengthBufferOffset;
    complete_local._0_4_ = availLen - i;
    if (2 < this->m_lengthBufferOffset) {
      __assert_fail("m_lengthBufferOffset <= numLengthBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astronautlabs[P]rtp/src/rtptcptransmitter.cpp"
                    ,0x375,
                    "int jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType, int, bool &, RTPMemoryManager *)"
                   );
    }
    if (this->m_lengthBufferOffset == 2) {
      shift = 0;
      r_1 = 0;
      for (num_1 = 1; -1 < num_1; num_1 = num_1 + -1) {
        shift = (uint)this->m_lengthBuffer[num_1] << ((byte)r_1 & 0x1f) | shift;
        r_1 = r_1 + 8;
      }
      this->m_dataLength = shift;
      this->m_dataBufferOffset = 0;
      if (shift == 0) {
        shift = 1;
      }
      puVar2 = (uint8_t *)operator_new__((long)shift,pMgr,1);
      this->m_pDataBuffer = puVar2;
      if (this->m_pDataBuffer == (uint8_t *)0x0) {
        return -1;
      }
    }
  }
  if ((this->m_lengthBufferOffset == 2) && (this->m_pDataBuffer != (uint8_t *)0x0)) {
    if (this->m_dataBufferOffset < this->m_dataLength) {
      local_4c = this->m_dataLength - this->m_dataBufferOffset;
      if ((int)complete_local < local_4c) {
        local_4c = (int)complete_local;
      }
      local_50 = 0;
      if (0 < local_4c) {
        sVar1 = recv(sock,this->m_pDataBuffer + this->m_dataBufferOffset,(long)local_4c,0);
        local_50 = (int)sVar1;
        if (local_50 < 0) {
          return -0xc5;
        }
      }
      this->m_dataBufferOffset = local_50 + this->m_dataBufferOffset;
    }
    if (this->m_dataBufferOffset == this->m_dataLength) {
      *complete = true;
    }
  }
  return 0;
}

Assistant:

int RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType sock, int availLen, bool &complete, RTPMemoryManager *pMgr)
{
	JRTPLIB_UNUSED(pMgr); // possibly unused

	const int numLengthBuffer = 2;
	if (m_lengthBufferOffset < numLengthBuffer) // first we need to get the length
	{
		assert(m_pDataBuffer == 0);
		int num = numLengthBuffer-m_lengthBufferOffset;
		if (num > availLen)
			num = availLen;

		int r = 0;
		if (num > 0)
		{
			r = (int)recv(sock, (char *)(m_lengthBuffer+m_lengthBufferOffset), num, 0);
			if (r < 0)
				return ERR_RTP_TCPTRANS_ERRORINRECV;
		}

		m_lengthBufferOffset += r;
		availLen -= r;

		assert(m_lengthBufferOffset <= numLengthBuffer);
		if (m_lengthBufferOffset == numLengthBuffer) // we can constuct a length
		{
			int l = 0;
			for (int i = numLengthBuffer-1, shift = 0 ; i >= 0 ; i--, shift += 8)
				l |= ((int)m_lengthBuffer[i]) << shift;

			m_dataLength = l;
			m_dataBufferOffset = 0;

			//cout << "Expecting " << m_dataLength << " bytes" << endl;

			// avoid allocation of length 0
			if (l == 0)
				l = 1;

			// We don't yet know if it's an RTP or RTCP packet, so we'll stick to RTP
			m_pDataBuffer = RTPNew(pMgr, RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET) uint8_t[l];
			if (m_pDataBuffer == 0)
				return ERR_RTP_OUTOFMEM;
		}
	}

	if (m_lengthBufferOffset == numLengthBuffer && m_pDataBuffer) // the last one is to make sure we didn't run out of memory
	{
		if (m_dataBufferOffset < m_dataLength)
		{
			int num = m_dataLength-m_dataBufferOffset;
			if (num > availLen)
				num = availLen;

			int r = 0;
			if (num > 0)
			{
				r = (int)recv(sock, (char *)(m_pDataBuffer+m_dataBufferOffset), num, 0);
				if (r < 0)
					return ERR_RTP_TCPTRANS_ERRORINRECV;
			}

			m_dataBufferOffset += r;
			availLen -= r;
		}

		if (m_dataBufferOffset == m_dataLength)
			complete = true;
	}
	return 0;
}